

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_transform_base.h
# Opt level: O2

int32_t __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::GetRotationCount
          (PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *this,Point2 *pred)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (pred->v_)._M_elems[1];
  iVar2 = (pred->v_)._M_elems[0];
  if (iVar2 == 0) {
    if (iVar1 != 0) {
      return (uint)(0 < iVar1) * 2 + 1;
    }
    return 0;
  }
  if (0 < iVar2) {
    return (iVar1 >> 0x1f) + 2;
  }
  return (uint)(0 < iVar1) * 3;
}

Assistant:

int32_t GetRotationCount(Point2 pred) const {
    const DataType sign_x = pred[0];
    const DataType sign_y = pred[1];

    int32_t rotation_count = 0;
    if (sign_x == 0) {
      if (sign_y == 0) {
        rotation_count = 0;
      } else if (sign_y > 0) {
        rotation_count = 3;
      } else {
        rotation_count = 1;
      }
    } else if (sign_x > 0) {
      if (sign_y >= 0) {
        rotation_count = 2;
      } else {
        rotation_count = 1;
      }
    } else {
      if (sign_y <= 0) {
        rotation_count = 0;
      } else {
        rotation_count = 3;
      }
    }
    return rotation_count;
  }